

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

int Abs_ManSupport1(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    vSupp->nSize = 0;
    Gia_ManIncrementTravId(p);
    Abs_ManSupport1_rec(p,pObj,vSupp);
    return vSupp->nSize;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                ,0x1da,"int Abs_ManSupport1(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

int Abs_ManSupport1( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    assert( Gia_ObjIsAnd(pObj) );
    Vec_IntClear( vSupp );
    Gia_ManIncrementTravId( p );
    Abs_ManSupport1_rec( p, pObj, vSupp );
    return Vec_IntSize(vSupp);
}